

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConvexDecomposition.cpp
# Opt level: O3

bool __thiscall
chrono::collision::ChConvexDecompositionHACD::AddTriangle
          (ChConvexDecompositionHACD *this,ChVector<double> *v1,ChVector<double> *v2,
          ChVector<double> *v3)

{
  vector<HACD::Vec3<double>,_std::allocator<HACD::Vec3<double>_>_> *this_00;
  long lVar1;
  Vec3<long> newtri;
  value_type local_98;
  value_type local_78;
  value_type local_58;
  value_type local_40;
  
  local_58.m_data[2] = v1->m_data[2];
  local_58.m_data[0] = v1->m_data[0];
  local_58.m_data[1] = v1->m_data[1];
  this_00 = &this->points;
  lVar1 = ((long)(this->points).
                 super__Vector_base<HACD::Vec3<double>,_std::allocator<HACD::Vec3<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->points).
                 super__Vector_base<HACD::Vec3<double>,_std::allocator<HACD::Vec3<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  local_78.m_data[2] = v2->m_data[2];
  local_78.m_data[0] = v2->m_data[0];
  local_78.m_data[1] = v2->m_data[1];
  local_98.m_data[2] = v3->m_data[2];
  local_98.m_data[0] = v3->m_data[0];
  local_98.m_data[1] = v3->m_data[1];
  std::vector<HACD::Vec3<double>,_std::allocator<HACD::Vec3<double>_>_>::push_back
            (this_00,&local_58);
  std::vector<HACD::Vec3<double>,_std::allocator<HACD::Vec3<double>_>_>::push_back
            (this_00,&local_78);
  std::vector<HACD::Vec3<double>,_std::allocator<HACD::Vec3<double>_>_>::push_back
            (this_00,&local_98);
  local_40.m_data[1] = lVar1 + 1;
  local_40.m_data[2] = lVar1 + 2;
  local_40.m_data[0] = lVar1;
  std::vector<HACD::Vec3<long>,_std::allocator<HACD::Vec3<long>_>_>::push_back
            (&this->triangles,&local_40);
  return true;
}

Assistant:

bool ChConvexDecompositionHACD::AddTriangle(const ChVector<>& v1, const ChVector<>& v2, const ChVector<>& v3) {
    long lastpoint = (long)this->points.size();
    HACD::Vec3<HACD::Real> vertex1(v1.x(), v1.y(), v1.z());
    HACD::Vec3<HACD::Real> vertex2(v2.x(), v2.y(), v2.z());
    HACD::Vec3<HACD::Real> vertex3(v3.x(), v3.y(), v3.z());
    this->points.push_back(vertex1);
    this->points.push_back(vertex2);
    this->points.push_back(vertex3);
    HACD::Vec3<long> newtri(lastpoint, lastpoint + 1, lastpoint + 2);
    this->triangles.push_back(newtri);
    return true;
}